

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

string_t * __thiscall
el::base::DefaultLogBuilder::build_abi_cxx11_
          (string_t *__return_storage_ptr__,DefaultLogBuilder *this,LogMessage *logMessage,
          bool appendNewLine)

{
  Level LVar1;
  TypedConfigurations *this_00;
  pointer pcVar2;
  pointer pcVar3;
  size_type *psVar4;
  uint uVar5;
  LogFormat *pLVar6;
  iterator iVar7;
  SubsecondPrecision *format;
  size_t sVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined7 in_register_00000009;
  key_type *pkVar11;
  char *buf;
  char *buff_00;
  SubsecondPrecision *in_R9;
  undefined8 *puVar12;
  timeval tval;
  string fs;
  string_t wcsFormatSpecifier;
  timeval currTime;
  char buff [110];
  string_t local_128;
  LogMessage *local_108;
  string_t local_100;
  undefined4 local_dc;
  key_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  LogMessage *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined6 uStack_50;
  undefined2 local_4a;
  undefined6 uStack_48;
  undefined8 uStack_42;
  char local_3a [10];
  
  local_dc = (undefined4)CONCAT71(in_register_00000009,appendNewLine);
  this_00 = logMessage->m_logger->m_typedConfigurations;
  LVar1 = logMessage->m_level;
  local_108 = logMessage;
  (*(this_00->super_ThreadSafe)._vptr_ThreadSafe[2])(this_00);
  pLVar6 = TypedConfigurations::unsafeGetConfigByRef<el::base::LogFormat>
                     (this_00,LVar1,&this_00->m_logFormatMap,"logFormat");
  local_b8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_b8;
  pcVar2 = (pLVar6->m_format)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pLVar6->m_format)._M_string_length);
  uStack_48 = 0;
  uStack_42 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_4a = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  uVar5 = pLVar6->m_flags;
  if ((uVar5 >> 0xb & 1) != 0) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"%app","");
    utils::Str::replaceFirstWithEscape
              (__return_storage_ptr__,&local_128,
               (string_t *)&local_108->m_logger->m_parentApplicationName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    uVar5 = pLVar6->m_flags;
  }
  if ((uVar5 >> 0xc & 1) != 0) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"%thread","");
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    iVar7 = utils::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(elStorage + 0x120),&local_d8);
    pkVar11 = (key_type *)
              ((long)iVar7.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     ._M_cur + 0x28);
    psVar4 = (size_type *)
             ((long)iVar7.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur + 0x30);
    if (iVar7.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      pkVar11 = &local_d8;
      psVar4 = &local_d8._M_string_length;
    }
    pcVar3 = (pkVar11->_M_dataplus)._M_p;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_100,pcVar3,pcVar3 + *psVar4);
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_128,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    uVar5 = pLVar6->m_flags;
  }
  if ((uVar5 & 2) != 0) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"%datetime","");
    pcVar3 = (pLVar6->m_dateTimeFormat)._M_dataplus._M_p;
    LVar1 = local_108->m_level;
    (*(this_00->super_ThreadSafe)._vptr_ThreadSafe[2])(this_00);
    format = TypedConfigurations::unsafeGetConfigByRef<el::base::SubsecondPrecision>
                       (this_00,LVar1,&this_00->m_subsecondPrecisionMap,"subsecondPrecision");
    gettimeofday((timeval *)&local_d8,(__timezone_ptr_t)0x0);
    tval.tv_usec = (__suseconds_t)pcVar3;
    tval.tv_sec = local_d8._M_string_length;
    utils::DateTime::timevalToString_abi_cxx11_
              ((string *)&local_100,(DateTime *)local_d8._M_dataplus._M_p,tval,(char *)format,in_R9)
    ;
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_128,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    uVar5 = pLVar6->m_flags;
  }
  if ((uVar5 & 0x40) != 0) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"%func","");
    utils::Str::replaceFirstWithEscape
              (__return_storage_ptr__,&local_128,(string_t *)&local_108->m_func);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    uVar5 = pLVar6->m_flags;
  }
  if ((uVar5 & 8) != 0) {
    local_a8 = local_a8 & 0xffffffffffffff00;
    utils::File::buildStrippedFilename((local_108->m_file)._M_dataplus._M_p,(char *)&local_a8,100);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"%file","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    sVar8 = strlen((char *)&local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,&local_a8,(long)&local_a8 + sVar8);
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_128,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    uVar5 = pLVar6->m_flags;
  }
  if ((uVar5 >> 0xe & 1) != 0) {
    local_a8 = local_a8 & 0xffffffffffffff00;
    utils::File::buildBaseFilename(&local_108->m_file,(char *)&local_a8,100,"/");
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"%fbase","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    sVar8 = strlen((char *)&local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,&local_a8,(long)&local_a8 + sVar8);
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_128,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    uVar5 = pLVar6->m_flags;
  }
  if ((uVar5 & 0x10) != 0) {
    local_a8 = local_a8 & 0xffffffffffffff00;
    utils::Str::convertAndAddToBuff(local_108->m_line,10,(char *)&local_a8,local_3a,false);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"%line","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    sVar8 = strlen((char *)&local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,&local_a8,(long)&local_a8 + sVar8);
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_128,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    uVar5 = pLVar6->m_flags;
  }
  if ((uVar5 & 0x20) != 0) {
    buff_00 = (char *)&local_a8;
    local_a8 = local_a8 & 0xffffffffffffff00;
    utils::File::buildStrippedFilename((local_108->m_file)._M_dataplus._M_p,buff_00,100);
    uVar9 = 0;
    do {
      if (*buff_00 == '\0') {
        buf = buff_00;
        if ((uVar9 < 0x6e) && (*buff_00 = ':', buf = local_3a, uVar9 != 0x6d)) {
          buff_00[1] = '\0';
          buf = buff_00 + 1;
        }
        break;
      }
      buff_00 = buff_00 + 1;
      uVar9 = uVar9 + 1;
      buf = local_3a;
    } while (uVar9 != 0x6e);
    utils::Str::convertAndAddToBuff(local_108->m_line,10,buf,local_3a,false);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"%loc","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    sVar8 = strlen((char *)&local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,&local_a8,(long)&local_a8 + sVar8);
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_128,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    uVar5 = pLVar6->m_flags;
  }
  if ((local_108->m_level == Verbose) && ((uVar5 & 0x400) != 0)) {
    local_a8 = local_a8 & 0xffffffffffffff00;
    utils::Str::convertAndAddToBuff
              ((ulong)local_108->m_verboseLevel,1,(char *)&local_a8,local_3a,false);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"%vlevel","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    sVar8 = strlen((char *)&local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,&local_a8,(long)&local_a8 + sVar8);
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_128,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    uVar5 = pLVar6->m_flags;
  }
  if ((uVar5 >> 9 & 1) != 0) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"%msg","");
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_128,&local_108->m_message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
  }
  puVar12 = *(undefined8 **)(elStorage + 0x158);
  if (puVar12 != *(undefined8 **)(elStorage + 0x160)) {
    do {
      std::__cxx11::string::string((string *)&local_128,(char *)*puVar12,(allocator *)&local_100);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)&local_100,local_128._M_dataplus._M_p,
                 local_128._M_dataplus._M_p + local_128._M_string_length);
      local_b0 = local_108;
      if (puVar12[3] == 0) {
        uVar10 = std::__throw_bad_function_call();
        pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != local_b8) {
          operator_delete(pcVar2);
        }
        _Unwind_Resume(uVar10);
      }
      (*(code *)puVar12[4])((string_t *)&local_d8,puVar12 + 1,&local_b0);
      utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_100,(string_t *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      puVar12 = puVar12 + 5;
    } while (puVar12 != *(undefined8 **)(elStorage + 0x160));
  }
  if ((char)local_dc != '\0') {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

base::type::string_t DefaultLogBuilder::build(const LogMessage* logMessage, bool appendNewLine) const {
  base::TypedConfigurations* tc = logMessage->logger()->typedConfigurations();
  const base::LogFormat* logFormat = &tc->logFormat(logMessage->level());
  base::type::string_t logLine = logFormat->format();
  char buff[base::consts::kSourceFilenameMaxLength + base::consts::kSourceLineMaxLength] = "";
  const char* bufLim = buff + sizeof(buff);
  if (logFormat->hasFlag(base::FormatFlags::AppName)) {
    // App name
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kAppNameFormatSpecifier,
        logMessage->logger()->parentApplicationName());
  }
  if (logFormat->hasFlag(base::FormatFlags::ThreadId)) {
    // Thread ID
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kThreadIdFormatSpecifier,
        ELPP->getThreadName(base::threading::getCurrentThreadId()));
  }
  if (logFormat->hasFlag(base::FormatFlags::DateTime)) {
    // DateTime
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kDateTimeFormatSpecifier,
        base::utils::DateTime::getDateTime(logFormat->dateTimeFormat().c_str(),
                                           &tc->subsecondPrecision(logMessage->level())));
  }
  if (logFormat->hasFlag(base::FormatFlags::Function)) {
    // Function
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFunctionFormatSpecifier, logMessage->func());
  }
  if (logFormat->hasFlag(base::FormatFlags::File)) {
    // File
    base::utils::Str::clearBuff(buff, base::consts::kSourceFilenameMaxLength);
    base::utils::File::buildStrippedFilename(logMessage->file().c_str(), buff);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFileFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::FileBase)) {
    // FileBase
    base::utils::Str::clearBuff(buff, base::consts::kSourceFilenameMaxLength);
    base::utils::File::buildBaseFilename(logMessage->file(), buff);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFileBaseFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::Line)) {
    // Line
    char* buf = base::utils::Str::clearBuff(buff, base::consts::kSourceLineMaxLength);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->line(), base::consts::kSourceLineMaxLength, buf, bufLim, false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogLineFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::Location)) {
    // Location
    char* buf = base::utils::Str::clearBuff(buff,
                                            base::consts::kSourceFilenameMaxLength + base::consts::kSourceLineMaxLength);
    base::utils::File::buildStrippedFilename(logMessage->file().c_str(), buff);
    buf = base::utils::Str::addToBuff(buff, buf, bufLim);
    buf = base::utils::Str::addToBuff(":", buf, bufLim);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->line(),  base::consts::kSourceLineMaxLength, buf, bufLim,
          false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogLocationFormatSpecifier, std::string(buff));
  }
  if (logMessage->level() == Level::Verbose && logFormat->hasFlag(base::FormatFlags::VerboseLevel)) {
    // Verbose level
    char* buf = base::utils::Str::clearBuff(buff, 1);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->verboseLevel(), 1, buf, bufLim, false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kVerboseLevelFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::LogMessage)) {
    // Log message
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kMessageFormatSpecifier, logMessage->message());
  }
#if !defined(ELPP_DISABLE_CUSTOM_FORMAT_SPECIFIERS)
  el::base::threading::ScopedLock lock_(ELPP->customFormatSpecifiersLock());
  ELPP_UNUSED(lock_);
  for (std::vector<CustomFormatSpecifier>::const_iterator it = ELPP->customFormatSpecifiers()->begin();
       it != ELPP->customFormatSpecifiers()->end(); ++it) {
    std::string fs(it->formatSpecifier());
    base::type::string_t wcsFormatSpecifier(fs.begin(), fs.end());
    base::utils::Str::replaceFirstWithEscape(logLine, wcsFormatSpecifier, it->resolver()(logMessage));
  }
#endif  // !defined(ELPP_DISABLE_CUSTOM_FORMAT_SPECIFIERS)
  if (appendNewLine) logLine += ELPP_LITERAL("\n");
  return logLine;
}